

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaReadVer.c
# Opt level: O0

void Prs_CreateSignalOut(Cba_Ntk_t *p,int iFon,Prs_Ntk_t *pNtk,int Sig)

{
  int iVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  Vec_Int_t *p_00;
  int iFonBuf;
  int iObjBuf;
  Vec_Int_t *vSigs;
  int SigValue;
  Prs_ManType_t SigType;
  int nBits;
  int RangeSize;
  int RangeId;
  int NameId;
  int RangeOut;
  int NameOut;
  int iFonNew;
  int i;
  int Sig_local;
  Prs_Ntk_t *pNtk_local;
  int iFon_local;
  Cba_Ntk_t *p_local;
  
  SigValue = 0;
  iVar1 = Abc_Lit2Att2(Sig);
  iVar2 = Abc_Lit2Var2(Sig);
  if (Sig != 0) {
    if (iVar1 == 0) {
      pcVar4 = Cba_NtkStr(p,iVar2);
      iVar1 = strncmp(pcVar4,"Open_",5);
      if (iVar1 != 0) {
        Cba_FonSetName(p,iFon,iVar2);
        Prs_CreateRange(p,iFon,iVar2);
      }
    }
    else {
      iVar3 = Cba_NtkNewStrId(p,"_occ%d_",(ulong)(uint)iFon);
      Cba_FonSetName(p,iFon,iVar3);
      Cba_NtkSetMap(p,iVar3,iFon);
      if (iVar1 == 1) {
        iVar1 = Prs_SliceName(pNtk,iVar2);
        iVar2 = Prs_SliceRange(pNtk,iVar2);
        SigValue = Cba_NtkRangeSize(p,iVar2);
        Vec_IntPushThree(&p->vArray0,iVar1,iVar2,iFon);
      }
      else {
        if (iVar1 != 3) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/cba/cbaReadVer.c"
                        ,0x628,"void Prs_CreateSignalOut(Cba_Ntk_t *, int, Prs_Ntk_t *, int)");
        }
        p_00 = Prs_CatSignals(pNtk,iVar2);
        Vec_IntReverseOrder(p_00);
        for (NameOut = 0; iVar1 = Vec_IntSize(p_00), NameOut < iVar1; NameOut = NameOut + 1) {
          iVar1 = Vec_IntEntry(p_00,NameOut);
          iVar2 = Abc_Lit2Att2(iVar1);
          iVar1 = Abc_Lit2Var2(iVar1);
          if (iVar2 == 0) {
            pcVar4 = Cba_NtkStr(p,iVar1);
            iVar2 = strncmp(pcVar4,"Open_",5);
            if (iVar2 != 0) {
              iVar2 = Cba_ObjAlloc(p,CBA_BOX_BUF,1,1);
              iVar3 = Cba_ObjFon0(p,iVar2);
              Cba_FonSetName(p,iVar3,iVar1);
              SigType = Prs_CreateRange(p,iVar3,iVar1);
              iVar1 = Cba_NtkHashRange(p,SigValue + SigType + -1,SigValue);
              iVar1 = Prs_CreateSlice(p,iFon,pNtk,iVar1);
              Cba_ObjSetFinFon(p,iVar2,0,iVar1);
              goto LAB_00459cf7;
            }
            SigValue = SigValue + 1;
          }
          else {
            if (iVar2 != 1) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/cba/cbaReadVer.c"
                            ,0x622,"void Prs_CreateSignalOut(Cba_Ntk_t *, int, Prs_Ntk_t *, int)");
            }
            iVar2 = Prs_SliceName(pNtk,iVar1);
            iVar1 = Prs_SliceRange(pNtk,iVar1);
            SigType = Cba_NtkRangeSize(p,iVar1);
            iVar3 = Cba_NtkHashRange(p,SigValue + SigType + -1,SigValue);
            iVar3 = Prs_CreateSlice(p,iFon,pNtk,iVar3);
            Vec_IntPushThree(&p->vArray0,iVar2,iVar1,iVar3);
LAB_00459cf7:
            SigValue = SigType + SigValue;
          }
        }
        Vec_IntReverseOrder(p_00);
      }
      Cba_FonHashRange(p,iFon,SigValue + -1,0);
    }
  }
  return;
}

Assistant:

void Prs_CreateSignalOut( Cba_Ntk_t * p, int iFon, Prs_Ntk_t * pNtk, int Sig )
{
    int i, iFonNew, NameOut, RangeOut, NameId, RangeId, RangeSize, nBits = 0; 
    Prs_ManType_t SigType = (Prs_ManType_t)Abc_Lit2Att2( Sig );
    int SigValue = Abc_Lit2Var2( Sig );
    if ( !Sig ) return;
    if ( SigType == CBA_PRS_NAME )
    {
        NameId = SigValue;
        if ( !strncmp(Cba_NtkStr(p, NameId), "Open_", 5) )
            return;
        Cba_FonSetName( p, iFon, NameId );
        Prs_CreateRange( p, iFon, NameId );
        return;
    }
    // create name for this fan
    NameOut = Cba_NtkNewStrId( p, "_occ%d_", iFon );
    Cba_FonSetName( p, iFon, NameOut );
    Cba_NtkSetMap( p, NameOut, iFon );
    // consider special cases
    if ( SigType == CBA_PRS_SLICE )
    {
        NameId  = Prs_SliceName(pNtk, SigValue);
        RangeId = Prs_SliceRange(pNtk, SigValue);
        nBits   = Cba_NtkRangeSize(p, RangeId);
        // save this slice
        Vec_IntPushThree( &p->vArray0, NameId, RangeId, iFon );
    }
    else if ( SigType == CBA_PRS_CONCAT )
    {
        Vec_Int_t * vSigs = Prs_CatSignals(pNtk, SigValue);
        Vec_IntReverseOrder( vSigs );
        Vec_IntForEachEntry( vSigs, Sig, i )
        {
            SigType = (Prs_ManType_t)Abc_Lit2Att2( Sig );
            SigValue = Abc_Lit2Var2( Sig );
            if ( SigType == CBA_PRS_NAME )
            {
                int iObjBuf, iFonBuf;
                // create buffer
                NameId = SigValue;
                if ( !strncmp(Cba_NtkStr(p, NameId), "Open_", 5) )
                {
                    nBits++;
                    continue;
                }
                iObjBuf   = Cba_ObjAlloc( p, CBA_BOX_BUF, 1, 1 );
                iFonBuf   = Cba_ObjFon0(p, iObjBuf);
                Cba_FonSetName( p, iFonBuf, NameId );
                RangeSize = Prs_CreateRange( p, iFonBuf, NameId );
                RangeOut  = Cba_NtkHashRange(p, nBits+RangeSize-1, nBits);
                // create slice
                iFonNew   = Prs_CreateSlice( p, iFon, pNtk, RangeOut );
                Cba_ObjSetFinFon( p, iObjBuf, 0, iFonNew );
            }
            else if ( SigType == CBA_PRS_SLICE )
            {
                NameId    = Prs_SliceName(pNtk, SigValue);
                RangeId   = Prs_SliceRange(pNtk, SigValue);
                RangeSize = Cba_NtkRangeSize(p, RangeId);
                RangeOut  = Cba_NtkHashRange(p, nBits+RangeSize-1, nBits);
                // create slice
                iFonNew   = Prs_CreateSlice( p, iFon, pNtk, RangeOut );
                // save this slice
                Vec_IntPushThree( &p->vArray0, NameId, RangeId, iFonNew );
            }
            else assert( 0 );
            // increment complete range
            nBits += RangeSize;
        }
        Vec_IntReverseOrder( vSigs );
    }
    else assert( 0 );
    // set the range for the output
    Cba_FonHashRange( p, iFon, nBits-1, 0 );
}